

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

void __thiscall
google::
sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::erase(sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *this,const_iterator pos)

{
  type *a;
  bool bVar1;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_60;
  
  local_60.pos.row_begin._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_60.pos.row_end._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_60.pos.col_current = (const_nonempty_iterator)0x0;
  local_60.end.col_current = (nonempty_iterator)0x0;
  local_60.ht = this;
  local_60.pos.row_current._M_current = local_60.pos.row_end._M_current;
  local_60.end.row_begin._M_current = local_60.pos.row_begin._M_current;
  local_60.end.row_end._M_current = local_60.pos.row_end._M_current;
  local_60.end.row_current._M_current = local_60.pos.row_end._M_current;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_60);
  if ((((pos.pos.row_begin._M_current != local_60.pos.row_begin._M_current) ||
       (pos.pos.row_end._M_current != local_60.pos.row_end._M_current)) ||
      (pos.pos.row_current._M_current != local_60.pos.row_current._M_current)) ||
     ((pos.pos.row_current._M_current != pos.pos.row_end._M_current &&
      (pos.pos.col_current != local_60.pos.col_current)))) {
    a = &(this->key_info).delkey;
    if (this->num_deleted == 0) {
      *pos.pos.col_current = *a;
    }
    else {
      bVar1 = sparse_hashtable<char_const*,char_const*,Hasher,google::sparse_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              ::KeyInfo::equals<char_const*,char_const*>
                        ((KeyInfo *)&this->key_info,a,pos.pos.col_current);
      *pos.pos.col_current = (this->key_info).delkey;
      if (bVar1) {
        return;
      }
    }
    this->num_deleted = this->num_deleted + 1;
    (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    consider_shrink_ = true;
  }
  return;
}

Assistant:

void erase(const_iterator pos) {
    if (pos == end()) return;  // sanity check
    if (set_deleted(pos)) {    // true if object has been newly deleted
      ++num_deleted;
      // will think about shrink after next insert
      settings.set_consider_shrink(true);
    }
  }